

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Run(AdvancedChangeSize *this)

{
  CallLogWrapper *pCVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  GLsizei width;
  bool bVar7;
  GLuint GVar8;
  GLint GVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *poVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  byte bVar18;
  int i;
  ulong uVar19;
  bool *pbVar20;
  char *format;
  void *pvVar21;
  long lVar22;
  CallLogWrapper *this_00;
  AdvancedChangeSize *pAVar23;
  byte bVar24;
  GLint GVar25;
  bool local_249;
  GLint length_1;
  undefined4 local_240;
  GLint local_23c;
  int local_238;
  GLsizei local_234;
  AdvancedChangeSize *local_230;
  CallLogWrapper *local_228;
  GLint length;
  undefined4 uStack_21c;
  long local_210 [2];
  GLint attached_shaders;
  undefined4 uStack_1fc;
  pointer local_1f0;
  GLint status;
  undefined4 uStack_1e4;
  pointer local_1d8;
  ulong local_1d0;
  GLenum type;
  undefined8 uStack_1c0;
  char *glsl_fs;
  char *glsl_vs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  ios_base local_138 [264];
  
  glsl_vs = 
  "#version 430 core\nout gl_PerVertex { vec4 gl_Position; };\nconst vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };\nvoid main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }"
  ;
  glsl_fs = 
  "#version 430 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0, rgba8) uniform image2D g_image[2];\nuniform ivec2 g_expected_size[2];\nuniform int g_0 = 0, g_1 = 1;\nvoid main() {\n  vec4 c = vec4(0, 1, 0, 1);\n  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);\n  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);\n  g_color = c;\n}"
  ;
  pCVar1 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
  ;
  GVar8 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b31,1,&glsl_vs);
  this->m_program[0] = GVar8;
  local_228 = pCVar1;
  GVar8 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b30,1,&glsl_fs);
  pCVar1 = local_228;
  this->m_program[1] = GVar8;
  lVar22 = 0;
  bVar7 = true;
  local_230 = this;
  do {
    bVar17 = bVar7;
    GVar8 = local_230->m_program[lVar22];
    if (GVar8 != 0) {
      glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar8,0x8b82,&status);
      if (status == 0) {
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar8,0x8b85,&attached_shaders);
        if (0 < (long)attached_shaders) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&shaders,(long)attached_shaders,(allocator_type *)&length);
          glu::CallLogWrapper::glGetAttachedShaders
                    (pCVar1,GVar8,attached_shaders,(GLsizei *)0x0,
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          if (0 < attached_shaders) {
            lVar22 = 0;
            do {
              glu::CallLogWrapper::glGetShaderiv
                        (pCVar1,shaders.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22],0x8b4f,
                         (GLint *)&type);
              if ((int)type < 0x8e87) {
                if (type == 0x8b30) {
                  format = "*** Fragment Shader ***\n";
                }
                else {
                  format = "*** Vertex Shader ***\n";
                  if (type != 0x8b31) {
                    if (type == 0x8dd9) {
                      format = "*** Geometry Shader ***\n";
                    }
                    else {
LAB_00a0ee5f:
                      format = "*** Unknown Shader ***\n";
                    }
                  }
                }
              }
              else if (type == 0x8e87) {
                format = "*** Tessellation Evaluation Shader ***\n";
              }
              else if (type == 0x8e88) {
                format = "*** Tessellation Control Shader ***\n";
              }
              else {
                if (type != 0x91b9) goto LAB_00a0ee5f;
                format = "*** Compute Shader ***\n";
              }
              anon_unknown_0::Output(format);
              glu::CallLogWrapper::glGetShaderiv
                        (pCVar1,shaders.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22],0x8b88,&length_1);
              if (0 < (long)length_1) {
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,
                           (allocator_type *)&local_234);
                glu::CallLogWrapper::glGetShaderSource
                          (pCVar1,shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar22],length_1,
                           (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_21c,length));
                anon_unknown_0::Output("%s\n",CONCAT44(uStack_21c,length));
                pvVar21 = (void *)CONCAT44(uStack_21c,length);
                if (pvVar21 != (void *)0x0) {
                  operator_delete(pvVar21,local_210[0] - (long)pvVar21);
                }
              }
              glu::CallLogWrapper::glGetShaderiv
                        (pCVar1,shaders.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22],0x8b84,&length_1);
              if (0 < (long)length_1) {
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,
                           (allocator_type *)&local_234);
                glu::CallLogWrapper::glGetShaderInfoLog
                          (pCVar1,shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar22],length_1,
                           (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_21c,length));
                anon_unknown_0::Output("%s\n",CONCAT44(uStack_21c,length));
                pvVar21 = (void *)CONCAT44(uStack_21c,length);
                if (pvVar21 != (void *)0x0) {
                  operator_delete(pvVar21,local_210[0] - (long)pvVar21);
                }
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < attached_shaders);
          }
          if (shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar8,0x8b84,&length);
        if (0 < (long)length) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&shaders,(long)length,
                     (allocator_type *)&type);
          glu::CallLogWrapper::glGetProgramInfoLog
                    (pCVar1,GVar8,length,(GLsizei *)0x0,
                     (GLchar *)
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          anon_unknown_0::Output
                    ("%s\n",shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          if (shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      if (status != 1) {
        return -1;
      }
    }
    this_00 = local_228;
    pAVar23 = local_230;
    lVar22 = 1;
    bVar7 = false;
  } while (bVar17);
  glu::CallLogWrapper::glUseProgramStages(local_228,local_230->m_pipeline,1,local_230->m_program[0])
  ;
  glu::CallLogWrapper::glUseProgramStages(this_00,pAVar23->m_pipeline,2,pAVar23->m_program[1]);
  glu::CallLogWrapper::glBindVertexArray(this_00,pAVar23->m_vertex_array);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pAVar23->m_pipeline);
  length_1 = 0x20;
  local_234 = 0x80;
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar23->m_texture[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8058,length_1,length_1,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,pAVar23->m_texture[0],0,'\0',0,35000,0x8058);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar23->m_texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8058,local_234,local_234,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,pAVar23->m_texture[1],0,'\0',0,35000,0x8058);
  iVar10 = 0x20;
  local_249 = true;
  GVar25 = 0x80;
  local_1d0 = 0;
  do {
    GVar8 = pAVar23->m_program[1];
    GVar9 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar8,"g_expected_size[0]");
    local_23c = iVar10;
    glu::CallLogWrapper::glProgramUniform2i(this_00,GVar8,GVar9,iVar10,iVar10);
    GVar8 = pAVar23->m_program[1];
    GVar9 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar8,"g_expected_size[1]");
    local_238 = GVar25;
    glu::CallLogWrapper::glProgramUniform2i(this_00,GVar8,GVar9,GVar25,GVar25);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
    iVar10 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)CONCAT44(extraout_var,iVar10);
    iVar11 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &attached_shaders,(long)(iVar10 * *(int *)(CONCAT44(extraout_var_00,iVar11) + 4)),
               (allocator_type *)&shaders);
    iVar10 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_01,iVar10);
    iVar10 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (local_228,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_02,iVar10) + 4),0x1907,0x1406,
               (void *)CONCAT44(uStack_1fc,attached_shaders));
    iVar10 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    uVar13 = *(uint *)CONCAT44(extraout_var_03,iVar10);
    iVar10 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)(CONCAT44(extraout_var_04,iVar10) + 4);
    iVar11 = (*((pAVar23->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
               m_renderCtx->_vptr_RenderContext[4])();
    lVar22 = CONCAT44(extraout_var_05,iVar11);
    bVar3 = *(byte *)(lVar22 + 8);
    bVar4 = *(byte *)(lVar22 + 0xc);
    bVar5 = *(byte *)(lVar22 + 0x10);
    bVar6 = *(byte *)(lVar22 + 0x14);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&status,
               (long)(int)(iVar10 * uVar13),(allocator_type *)&shaders);
    glu::CallLogWrapper::glReadPixels
              (local_228,0,0,uVar13,iVar10,0x1908,0x1406,(void *)CONCAT44(uStack_1e4,status));
    pvVar21 = (void *)CONCAT44(uStack_1e4,status);
    GVar25 = local_23c;
    iVar11 = local_238;
    pAVar23 = local_230;
    if (iVar10 < 1) {
      bVar18 = 1;
      bVar24 = 1;
    }
    else {
      uVar12 = 0;
      local_240 = 0;
      iVar15 = 0;
      bVar24 = 1;
      do {
        uVar16 = (ulong)uVar12;
        uVar19 = (ulong)uVar13;
        if (0 < (int)uVar13) {
LAB_00a0f3f0:
          lVar22 = (long)(int)uVar16 * 0x10;
          puVar2 = (undefined8 *)((long)pvVar21 + lVar22);
          if ((((ABS(*(float *)((long)pvVar21 + lVar22)) <= 1.0 / (float)(1 << (bVar3 & 0x1f))) &&
               (ABS(*(float *)((long)puVar2 + 4) + -1.0) <= 1.0 / (float)(1 << (bVar4 & 0x1f)))) &&
              (ABS(*(float *)(puVar2 + 1)) <= 1.0 / (float)(1 << (bVar5 & 0x1f)))) &&
             (ABS(*(float *)((long)puVar2 + 0xc) + -1.0) <= 1.0 / (float)(1 << (bVar6 & 0x1f))))
          goto code_r0x00a0f443;
          _type = *puVar2;
          uStack_1c0 = puVar2[1];
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaders);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&shaders,"[",1);
          pAVar23 = local_230;
          lVar22 = 0;
          do {
            poVar14 = std::ostream::_M_insert<double>((double)(float)(&type)[lVar22]);
            pbVar20 = glcts::fixed_sample_locations_values + 1;
            if (lVar22 != 3) {
              pbVar20 = (bool *)0x1cafe51;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,pbVar20,(ulong)(lVar22 != 3))
            ;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&shaders,"]",1);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaders);
          std::ios_base::~ios_base(local_138);
          anon_unknown_0::Output("First bad color: %s.\n",CONCAT44(uStack_21c,length));
          iVar11 = local_238;
          GVar25 = local_23c;
          bVar18 = (byte)local_240;
          if ((long *)CONCAT44(uStack_21c,length) != local_210) {
            operator_delete((long *)CONCAT44(uStack_21c,length),local_210[0] + 1);
          }
          pvVar21 = (void *)CONCAT44(uStack_1e4,status);
          bVar24 = 0;
          break;
        }
LAB_00a0f44a:
        iVar15 = iVar15 + 1;
        uVar12 = uVar12 + uVar13;
        bVar18 = iVar10 <= iVar15;
        local_240 = (undefined4)CONCAT71((int7)(uVar16 >> 8),bVar18);
      } while (iVar15 != iVar10);
    }
    if (pvVar21 != (void *)0x0) {
      operator_delete(pvVar21,(long)local_1d8 - (long)pvVar21);
    }
    pvVar21 = (void *)CONCAT44(uStack_1fc,attached_shaders);
    if (pvVar21 != (void *)0x0) {
      operator_delete(pvVar21,(long)local_1f0 - (long)pvVar21);
    }
    this_00 = local_228;
    if ((bVar18 & bVar24) == 0) break;
    iVar10 = GVar25 / 2;
    GVar25 = iVar11 / 2;
    glu::CallLogWrapper::glBindTexture(local_228,0xde1,pAVar23->m_texture[0]);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8058,iVar10,iVar10,0,0x1908,0x1406,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar23->m_texture[1]);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8058,GVar25,GVar25,0,0x1908,0x1406,(void *)0x0);
    local_249 = (uint)local_1d0 < 2;
    uVar13 = (uint)local_1d0 + 1;
    local_1d0 = (ulong)uVar13;
  } while (uVar13 != 3);
  return -(ulong)local_249;
code_r0x00a0f443:
  uVar16 = (ulong)((int)uVar16 + 1);
  uVar19 = uVar19 - 1;
  if (uVar19 == 0) goto LAB_00a0f44a;
  goto LAB_00a0f3f0;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "out gl_PerVertex { vec4 gl_Position; };" NL
									"const vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };" NL
									"void main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }";
		const char* const glsl_fs =
			"#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
			"layout(binding = 0, rgba8) uniform image2D g_image[2];" NL "uniform ivec2 g_expected_size[2];" NL
			"uniform int g_0 = 0, g_1 = 1;" NL "void main() {" NL "  vec4 c = vec4(0, 1, 0, 1);" NL
			"  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);" NL
			"  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);" NL "  g_color = c;" NL
			"}";
		m_program[0] = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_program[1] = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		for (int i = 0; i < 2; ++i)
			if (!CheckProgram(m_program[i]))
				return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);

		glBindVertexArray(m_vertex_array);
		glBindProgramPipeline(m_pipeline);

		int size[2] = { 32, 128 };
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[i], size[i], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindImageTexture(i, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
		}

		for (int i = 0; i < 3; ++i)
		{
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[0]"), size[0],
							   size[0]);
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[1]"), size[1],
							   size[1]);
			glClear(GL_COLOR_BUFFER_BIT);
			glDrawArrays(GL_TRIANGLES, 0, 3);

			{
				bool			  status = true;
				std::vector<vec3> fb(getWindowWidth() * getWindowHeight());
				glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
				if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
					status = false;
				if (!status)
					return ERROR;
			}

			size[0] /= 2;
			size[1] /= 2;

			glBindTexture(GL_TEXTURE_2D, m_texture[0]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[0], size[0], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindTexture(GL_TEXTURE_2D, m_texture[1]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[1], size[1], 0, GL_RGBA, GL_FLOAT, NULL);
		}
		return NO_ERROR;
	}